

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HtmlBuilder.h
# Opt level: O0

TAG * __thiscall HTML::TAG::text<char[21]>(TAG *this,char (*value) [21])

{
  char (*value_local) [21];
  TAG *this_local;
  
  std::operator<<((ostream *)&this->field_0x38,*value);
  text(this);
  return this;
}

Assistant:

TAG &text(const T &value) {
    m_value << value;
    text();
    return *this;
  }